

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::
getVariants<Kernel::Literal*>
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Literal *query,
          bool retrieveSubstitutions)

{
  long *plVar1;
  int *piVar2;
  Node *root;
  long lVar3;
  void **head;
  RenamingSubstitution *this_00;
  Literal *pLVar4;
  Leaf *pLVar5;
  int in_ECX;
  undefined7 in_register_00000011;
  ResultSubstitutionSP resultSubst;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  svBindings;
  long *local_a0;
  RenamingSubstitution *local_98;
  RefCounter *pRStack_90;
  long *local_88;
  anon_class_32_3_b6b1deac_for__func local_80;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_60;
  IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  local_50;
  
  pLVar4 = (Literal *)CONCAT71(in_register_00000011,retrieveSubstitutions);
  if (in_ECX == 0) {
    this_00 = (RenamingSubstitution *)0x0;
  }
  else {
    this_00 = (RenamingSubstitution *)::operator_new(0x28);
    RenamingSubstitution::RenamingSubstitution(this_00);
  }
  if ((char)in_ECX == '\0') {
    local_98 = (RenamingSubstitution *)0x0;
    pRStack_90 = (RefCounter *)0x0;
    pLVar4 = Kernel::Renaming::normalize(pLVar4);
  }
  else {
    local_98 = this_00;
    pRStack_90 = (RefCounter *)
                 ::Lib::FixedSizeAllocator<8UL>::alloc
                           ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    pRStack_90->_val = 1;
    Kernel::Renaming::normalizeVariables
              ((this_00->_query)._self._M_t.
               super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
               super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
               super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,pLVar4);
    pLVar4 = Kernel::Renaming::apply
                       ((this_00->_query)._self._M_t.
                        super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                        .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,pLVar4);
  }
  ::Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_60);
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(auto:1,auto:2)_1_>
            ((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)query,pLVar4,false,
             &local_60);
  root = *(Node **)&(query->super_Term)._functor;
  if (root == (Node *)0x0) {
    pLVar5 = (Leaf *)0x0;
  }
  else {
    pLVar5 = findLeaf((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)query,root,
                      (BindingMap *)
                      local_60._self._M_t.
                      super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                      .
                      super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                      ._M_head_impl);
  }
  if (pLVar5 == (Leaf *)0x0) {
    ::Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
    ::getEmpty();
  }
  else {
    (*(pLVar5->super_Node)._vptr_Node[8])(&local_88,pLVar5);
    if (local_88 == (long *)0x0) {
      local_a0 = local_88;
    }
    else {
      lVar3 = local_88[1];
      *(int *)(local_88 + 1) = (int)lVar3 + 1;
      local_a0 = local_88;
      *(int *)(local_88 + 1) = (int)lVar3 + 2;
      plVar1 = local_88 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      if ((int)*plVar1 == 0) {
        (**(code **)(*local_88 + 8))();
      }
    }
    local_80.resultSubst._obj = &local_98->super_ResultSubstitution;
    local_80.resultSubst._refCnt = pRStack_90;
    if (pRStack_90 != (RefCounter *)0x0 && local_98 != (RenamingSubstitution *)0x0) {
      pRStack_90->_val = pRStack_90->_val + 1;
    }
    local_80.retrieveSubstitutions = (bool)(char)in_ECX;
    local_80.renaming._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
          )(__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
            )this_00;
    ::Lib::IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>::
    map<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_>
              (&local_50,&local_a0,&local_80);
    ::Lib::
    pvi<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>
              ((Lib *)this,&local_50);
    if (local_50._iter._inner._core !=
        (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)0x0) {
      piVar2 = &(local_50._iter._inner._core)->_refCnt;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (*(local_50._iter._inner._core)->_vptr_IteratorCore[1])();
      }
    }
    if ((((local_50._iter._func.resultSubst._obj != (ResultSubstitution *)0x0) &&
         (local_50._iter._func.resultSubst._refCnt != (RefCounter *)0x0)) &&
        ((local_50._iter._func.resultSubst._refCnt)->_val =
              (local_50._iter._func.resultSubst._refCnt)->_val + -1,
        (local_50._iter._func.resultSubst._refCnt)->_val == 0)) &&
       ((*(local_50._iter._func.resultSubst._obj)->_vptr_ResultSubstitution[1])(),
       local_50._iter._func.resultSubst._refCnt != (RefCounter *)0x0)) {
      *(undefined8 *)local_50._iter._func.resultSubst._refCnt =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._iter._func.resultSubst._refCnt;
    }
    if ((_Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
         )local_50._iter._func.renaming._M_t.
          super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          ._M_t.
          super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
          .
          super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
         )0x0) {
      (*((ResultSubstitution *)
        local_50._iter._func.renaming._M_t.
        super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
        .
        super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
        ._M_head_impl)->_vptr_ResultSubstitution[1])();
    }
    local_50._iter._func.renaming._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
          )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
            )0x0;
    if ((((RenamingSubstitution *)local_80.resultSubst._obj != (RenamingSubstitution *)0x0) &&
        (local_80.resultSubst._refCnt != (RefCounter *)0x0)) &&
       (((local_80.resultSubst._refCnt)->_val = (local_80.resultSubst._refCnt)->_val + -1,
        (local_80.resultSubst._refCnt)->_val == 0 &&
        ((*((ResultSubstitution *)&(local_80.resultSubst._obj)->_vptr_ResultSubstitution)->
           _vptr_ResultSubstitution[1])(), local_80.resultSubst._refCnt != (RefCounter *)0x0)))) {
      *(undefined8 *)local_80.resultSubst._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_80.resultSubst._refCnt;
    }
    if (local_80.renaming._M_t.
        super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
        .
        super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
         )0x0) {
      (*((ResultSubstitution *)
        local_80.renaming._M_t.
        super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
        ._M_t.
        super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
        .
        super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
        ._M_head_impl)->_vptr_ResultSubstitution[1])();
    }
    local_80.renaming._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,_true,_true>
          )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
            )0x0;
    if (local_a0 != (long *)0x0) {
      plVar1 = local_a0 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      if ((int)*plVar1 == 0) {
        (**(code **)(*local_a0 + 8))();
      }
    }
    if (local_88 != (long *)0x0) {
      plVar1 = local_88 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      if ((int)*plVar1 == 0) {
        (**(code **)(*local_88 + 8))();
      }
    }
    this_00 = (RenamingSubstitution *)0x0;
  }
  ::Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_60);
  if (((local_98 != (RenamingSubstitution *)0x0) && (pRStack_90 != (RefCounter *)0x0)) &&
     ((pRStack_90->_val = pRStack_90->_val + -1, pRStack_90->_val == 0 &&
      ((*(local_98->super_ResultSubstitution)._vptr_ResultSubstitution[1])(),
      pRStack_90 != (RefCounter *)0x0)))) {
    *(undefined8 *)pRStack_90 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRStack_90;
  }
  if (this_00 != (RenamingSubstitution *)0x0) {
    (*(this_00->super_ResultSubstitution)._vptr_ResultSubstitution[1])(this_00);
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>> getVariants(Query query, bool retrieveSubstitutions)
    {
      auto renaming = retrieveSubstitutions ? std::make_unique<RenamingSubstitution>() : std::unique_ptr<RenamingSubstitution>(nullptr);
      ResultSubstitutionSP resultSubst = retrieveSubstitutions ? ResultSubstitutionSP(&*renaming) : ResultSubstitutionSP();

      Query normQuery;
      if (retrieveSubstitutions) {
        renaming->_query->normalizeVariables(query);
        normQuery = renaming->_query->apply(query);
      } else {
        normQuery = Renaming::normalize(query);
      }

      Recycled<BindingMap> svBindings;
      createBindings(normQuery, /* reversed */ false,
          [&](auto v, auto t) { {
            svBindings->insert(v, t);
          } });
      Leaf* leaf = findLeaf(*svBindings);
      if(leaf==0) {
        return VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>>::getEmpty();
      } else {
        return pvi(iterTraits(leaf->allChildren())
          .map([retrieveSubstitutions, renaming = std::move(renaming), resultSubst](LeafData* ld) 
            {
              ResultSubstitutionSP subs;
              if (retrieveSubstitutions) {
                renaming->_result->reset();
                renaming->_result->normalizeVariables(ld->key());
                subs = resultSubst;
              }
              return QueryRes(subs, ld);
            }));
      }
    }